

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void __thiscall
FGUIDCVar::FGUIDCVar
          (FGUIDCVar *this,char *name,GUID *def,DWORD flags,_func_void_FGUIDCVar_ptr *callback)

{
  undefined8 uVar1;
  WORD WVar2;
  WORD WVar3;
  DWORD DVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,flags,(_func_void_FBaseCVar_ptr *)callback);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_006f1ea0;
  if (def == (GUID *)0x0) {
    DVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    (this->DefaultValue).Data1 = 0;
    (this->DefaultValue).Data2 = 0;
    (this->DefaultValue).Data3 = 0;
    (this->DefaultValue).Data4[0] = '\0';
    (this->DefaultValue).Data4[1] = '\0';
    (this->DefaultValue).Data4[2] = '\0';
    (this->DefaultValue).Data4[3] = '\0';
    (this->DefaultValue).Data4[4] = '\0';
    (this->DefaultValue).Data4[5] = '\0';
    (this->DefaultValue).Data4[6] = '\0';
    (this->DefaultValue).Data4[7] = '\0';
  }
  else {
    WVar2 = def->Data2;
    WVar3 = def->Data3;
    uVar1 = *(undefined8 *)def->Data4;
    (this->DefaultValue).Data1 = def->Data1;
    (this->DefaultValue).Data2 = WVar2;
    (this->DefaultValue).Data3 = WVar3;
    *(undefined8 *)(this->DefaultValue).Data4 = uVar1;
    if (((this->super_FBaseCVar).Flags & 0x80) == 0) {
      return;
    }
    DVar4 = def->Data1;
    uVar5._0_2_ = def->Data2;
    uVar5._2_2_ = def->Data3;
    uVar6 = *(undefined4 *)def->Data4;
    uVar7 = *(undefined4 *)(def->Data4 + 4);
  }
  (this->Value).Data1 = DVar4;
  (this->Value).Data2 = (short)uVar5;
  (this->Value).Data3 = (short)((uint)uVar5 >> 0x10);
  *(undefined4 *)(this->Value).Data4 = uVar6;
  *(undefined4 *)((this->Value).Data4 + 4) = uVar7;
  return;
}

Assistant:

FGUIDCVar::FGUIDCVar (const char *name, const GUID *def, DWORD flags, void (*callback)(FGUIDCVar &))
: FBaseCVar (name, flags, reinterpret_cast<void (*)(FBaseCVar &)>(callback))
{
	if (def != NULL)
	{
		DefaultValue = *def;
		if (Flags & CVAR_ISDEFAULT)
			Value = *def;
	}
	else
	{
		memset (&Value, 0, sizeof(DefaultValue));
		memset (&DefaultValue, 0, sizeof(DefaultValue));
	}
}